

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<KNNClassifier>::dealloc(value_and_holder *v_h)

{
  bool bVar1;
  unique_ptr<KNNClassifier,_std::default_delete<KNNClassifier>_> *this;
  KNNClassifier **ppKVar2;
  void **ppvVar3;
  value_and_holder *v_h_local;
  
  bVar1 = detail::value_and_holder::holder_constructed(v_h);
  if (bVar1) {
    this = detail::value_and_holder::
           holder<std::unique_ptr<KNNClassifier,std::default_delete<KNNClassifier>>>(v_h);
    std::unique_ptr<KNNClassifier,_std::default_delete<KNNClassifier>_>::~unique_ptr(this);
    detail::value_and_holder::set_holder_constructed(v_h,false);
  }
  else {
    ppKVar2 = detail::value_and_holder::value_ptr<KNNClassifier>(v_h);
    detail::call_operator_delete(*ppKVar2,v_h->type->type_size,v_h->type->type_align);
  }
  ppvVar3 = detail::value_and_holder::value_ptr<void>(v_h);
  *ppvVar3 = (void *)0x0;
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }